

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

DS_STATUS ds_list_append(DsList *list,void *data)

{
  DS_STATUS DVar1;
  DsListEntry *in;
  DS_STATUS DVar2;
  
  DVar2 = DS_STATUS_NULL;
  if (list != (DsList *)0x0) {
    in = (DsListEntry *)malloc(0x18);
    if (in == (DsListEntry *)0x0) {
      DVar2 = DS_STATUS_OUTMEM;
    }
    else {
      in->data = data;
      in->next = (DsListEntry *)0x0;
      in->prev = (DsListEntry *)0x0;
      DVar1 = ds_entry_append(&list->entry,in);
      if (DVar1 == DS_STATUS_OK) {
        list->size = list->size + 1;
        DVar2 = DS_STATUS_OK;
      }
      else {
        free(in);
      }
    }
  }
  return DVar2;
}

Assistant:

DS_STATUS ds_list_append(DsList *list, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    if (DS_STATUS_OK != ds_entry_append(&list->entry, in))
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}